

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O0

int nn_xbus_recv(nn_sockbase *self,nn_msg *msg)

{
  size_t sVar1;
  void *__s;
  undefined8 *puVar2;
  nn_fq *in_RSI;
  nn_chunkref *in_RDI;
  nn_pipe *pipe;
  nn_xbus *xbus;
  int rc;
  nn_chunkref *local_38;
  nn_chunkref *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  local_38 = in_RDI;
  if (in_RDI == (nn_chunkref *)0x0) {
    local_38 = (nn_chunkref *)0x0;
  }
  while( true ) {
    in_stack_ffffffffffffffe4 =
         nn_fq_recv(in_RSI,(nn_msg *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    (nn_pipe **)local_38);
    if (in_stack_ffffffffffffffe4 < 0) {
      return in_stack_ffffffffffffffe4;
    }
    sVar1 = nn_chunkref_size(in_stack_ffffffffffffffd0);
    if (sVar1 == 0) break;
    nn_msg_term((nn_msg *)0x1d70b9);
  }
  nn_chunkref_term(in_stack_ffffffffffffffd0);
  nn_chunkref_init(in_RDI,(size_t)in_RSI);
  __s = nn_chunkref_data((nn_chunkref *)in_RSI);
  memset(__s,0,8);
  puVar2 = (undefined8 *)nn_chunkref_data((nn_chunkref *)in_RSI);
  *puVar2 = in_stack_ffffffffffffffd0;
  return 0;
}

Assistant:

int nn_xbus_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xbus *xbus;
    struct nn_pipe *pipe;

    xbus = nn_cont (self, struct nn_xbus, sockbase);

    while (1) {

        /*  Get next message in fair-queued manner. */
        rc = nn_fq_recv (&xbus->inpipes, msg, &pipe);
        if (nn_slow (rc < 0))
            return rc;

        /*  The message should have no header. Drop malformed messages. */
        if (nn_chunkref_size (&msg->sphdr) == 0)
            break;
        nn_msg_term (msg);
    }

    /*  Add pipe ID to the message header. */
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, sizeof (uint64_t));
    memset (nn_chunkref_data (&msg->sphdr), 0, sizeof (uint64_t));
    memcpy (nn_chunkref_data (&msg->sphdr), &pipe, sizeof (pipe));

    return 0;
}